

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_creader_create(Curl_creader **preader,Curl_easy *data,Curl_crtype *crt,
                            Curl_creader_phase phase)

{
  CURLcode CVar1;
  Curl_creader *pCVar2;
  Curl_creader *pCVar3;
  
  pCVar2 = (Curl_creader *)(*Curl_ccalloc)(1,crt->creader_size);
  if (pCVar2 == (Curl_creader *)0x0) {
    *preader = (Curl_creader *)0x0;
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pCVar2->crt = crt;
    pCVar2->ctx = pCVar2;
    pCVar2->phase = phase;
    CVar1 = (*crt->do_init)(data,pCVar2);
    pCVar3 = pCVar2;
    if (CVar1 != CURLE_OK) {
      pCVar3 = (Curl_creader *)0x0;
    }
    *preader = pCVar3;
    if (CVar1 == CURLE_OK) {
      return CURLE_OK;
    }
  }
  (*Curl_cfree)(pCVar2);
  return CVar1;
}

Assistant:

CURLcode Curl_creader_create(struct Curl_creader **preader,
                             struct Curl_easy *data,
                             const struct Curl_crtype *crt,
                             Curl_creader_phase phase)
{
  struct Curl_creader *reader = NULL;
  CURLcode result = CURLE_OUT_OF_MEMORY;
  void *p;

  DEBUGASSERT(crt->creader_size >= sizeof(struct Curl_creader));
  p = calloc(1, crt->creader_size);
  if(!p)
    goto out;

  reader = (struct Curl_creader *)p;
  reader->crt = crt;
  reader->ctx = p;
  reader->phase = phase;
  result = crt->do_init(data, reader);

out:
  *preader = result ? NULL : reader;
  if(result)
    free(reader);
  return result;
}